

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject.cpp
# Opt level: O0

string * __thiscall
bidfx_public_api::price::subject::Subject::GetComponent
          (string *__return_storage_ptr__,Subject *this,string *key)

{
  const_reference pvVar1;
  allocator<char> local_25;
  int local_24;
  string *psStack_20;
  int index;
  string *key_local;
  Subject *this_local;
  
  psStack_20 = key;
  key_local = (string *)this;
  this_local = (Subject *)__return_storage_ptr__;
  local_24 = SubjectUtils::BinarySearch(&this->components_,key);
  if (local_24 < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_25);
    std::allocator<char>::~allocator(&local_25);
  }
  else {
    pvVar1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->components_,(long)(local_24 + 1));
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Subject::GetComponent(std::string key) const
{
    int index = SubjectUtils::BinarySearch(&components_, key);

    if (index >= 0)
    {
        return components_[index + 1];
    }

    return "";
}